

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase302::run(TestCase302 *this)

{
  long lVar1;
  Reader reader;
  bool bVar2;
  Request<capnp::DynamicStruct,_capnp::DynamicStruct> *value;
  Response<capnp::DynamicStruct> *value_00;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  int iVar3;
  Maybe<capnp::MessageSize> *pMVar4;
  StringPtr methodName;
  StringPtr name;
  StringPtr name_00;
  StringPtr methodName_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  StringPtr name_04;
  StringPtr name_05;
  int chainedCallCount;
  int callCount;
  WaitScope waitScope;
  Response<capnp::DynamicStruct> response;
  ArrayPtr<const_char> local_2b8;
  Response<capnproto_test::capnp::test::TestAllTypes> response2;
  Request<capnp::DynamicStruct,_capnp::DynamicStruct> pipelineRequest;
  Client local_218;
  PipelineFor<capnp::DynamicCapability> outCap;
  Request<capnp::DynamicStruct,_capnp::DynamicStruct> request;
  RemotePromise<capnp::DynamicStruct> promise;
  RemotePromise<capnproto_test::capnp::test::TestAllTypes> pipelinePromise2;
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  pipelineRequest2;
  RemotePromise<capnp::DynamicStruct> pipelinePromise;
  EventLoop loop;
  Maybe<capnp::MessageSize> local_70;
  Maybe<capnp::MessageSize> local_58;
  Maybe<capnp::MessageSize> local_40;
  
  kj::EventLoop::EventLoop(&loop);
  waitScope.busyPollInterval = 0xffffffff;
  waitScope.loop = &loop;
  kj::EventLoop::enterScope(&loop);
  callCount = 0;
  chainedCallCount = 0;
  kj::heap<capnp::_::TestPipelineImpl,int&>((kj *)&pipelineRequest,&callCount);
  capnproto_test::capnp::test::TestPipeline::Client::Client<capnp::_::TestPipelineImpl,void>
            ((Client *)&request,(Own<capnp::_::TestPipelineImpl> *)&pipelineRequest);
  lVar1 = *(long *)((long)request.super_Builder.schema.super_Schema.raw + -0x18);
  local_218.super_Client.hook.disposer =
       *(Disposer **)((long)&request.super_Builder.schema.super_Schema.raw + lVar1);
  local_218.super_Client.hook.ptr =
       *(ClientHook **)((long)&request.super_Builder.builder.segment + lVar1);
  *(undefined8 *)((long)&request.super_Builder.builder.segment + lVar1) = 0;
  local_218.schema.super_Schema.raw = (Schema)((long)schemas::s_a5a404caa61d4cd0 + 0x48);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&request.super_Builder.builder);
  kj::Own<capnp::_::TestPipelineImpl>::dispose((Own<capnp::_::TestPipelineImpl> *)&pipelineRequest);
  pMVar4 = &local_40;
  local_40.ptr.isSet = false;
  methodName.content.size_ = 7;
  methodName.content.ptr = "getCap";
  DynamicCapability::Client::newRequest(&request,&local_218,methodName,pMVar4);
  iVar3 = (int)pMVar4;
  pipelineRequest.super_Builder.schema.super_Schema.raw._0_4_ = 3;
  pipelineRequest.super_Builder.builder.segment = (SegmentBuilder *)0xea;
  name_03.content.size_ = 2;
  name_03.content.ptr = "n";
  DynamicStruct::Builder::set(&request.super_Builder,name_03,(Reader *)&pipelineRequest);
  DynamicValue::Reader::~Reader((Reader *)&pipelineRequest);
  kj::heap<capnp::_::TestInterfaceImpl,int&>((kj *)&response2,&chainedCallCount);
  capnproto_test::capnp::test::TestInterface::Client::Client<capnp::_::TestInterfaceImpl,void>
            ((Client *)&response,(Own<capnp::_::TestInterfaceImpl> *)&response2);
  DynamicValue::Reader::
  Reader<capnproto_test::capnp::test::TestInterface::Client,capnp::DynamicCapability::Client>
            ((Reader *)&pipelineRequest,(Client *)&response);
  value = &pipelineRequest;
  name_04.content.size_ = 6;
  name_04.content.ptr = "inCap";
  DynamicStruct::Builder::set(&request.super_Builder,name_04,(Reader *)value);
  DynamicValue::Reader::~Reader((Reader *)&pipelineRequest);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&response.super_Reader.reader);
  kj::Own<capnp::_::TestInterfaceImpl>::dispose((Own<capnp::_::TestInterfaceImpl> *)&response2);
  Request<capnp::DynamicStruct,_capnp::DynamicStruct>::send
            ((Request<capnp::DynamicStruct,_capnp::DynamicStruct> *)&promise,(int)&request,__buf,
             (size_t)value,iVar3);
  name.content.size_ = 7;
  name.content.ptr = "outBox";
  DynamicStruct::Pipeline::get((Pipeline *)&response,&promise.super_Pipeline,name);
  DynamicValue::Pipeline::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            ((PipelineFor<DynamicStruct> *)&response2,(Pipeline *)&response);
  name_00.content.size_ = 4;
  name_00.content.ptr = "cap";
  DynamicStruct::Pipeline::get((Pipeline *)&pipelineRequest,(Pipeline *)&response2,name_00);
  DynamicValue::Pipeline::AsImpl<capnp::DynamicCapability,_(capnp::Kind)7>::apply
            (&outCap,(Pipeline *)&pipelineRequest);
  DynamicValue::Pipeline::~Pipeline((Pipeline *)&pipelineRequest);
  AnyPointer::Pipeline::~Pipeline((Pipeline *)&response2.super_Reader._reader.capTable);
  DynamicValue::Pipeline::~Pipeline((Pipeline *)&response);
  pMVar4 = &local_58;
  local_58.ptr.isSet = false;
  methodName_00.content.size_ = 4;
  methodName_00.content.ptr = "foo";
  DynamicCapability::Client::newRequest(&pipelineRequest,&outCap,methodName_00,pMVar4);
  iVar3 = (int)pMVar4;
  value_00 = &response;
  response.super_Reader.schema.super_Schema.raw._0_4_ = 3;
  response.super_Reader.reader.segment = (SegmentReader *)0x141;
  name_05.content.size_ = 2;
  name_05.content.ptr = "i";
  DynamicStruct::Builder::set(&pipelineRequest.super_Builder,name_05,(Reader *)value_00);
  DynamicValue::Reader::~Reader((Reader *)&response);
  Request<capnp::DynamicStruct,_capnp::DynamicStruct>::send
            ((Request<capnp::DynamicStruct,_capnp::DynamicStruct> *)&pipelinePromise,
             (int)&pipelineRequest,__buf_00,(size_t)value_00,iVar3);
  Capability::Client::castAs<capnproto_test::capnp::test::TestExtends>
            ((Client *)&response,&outCap.super_Client);
  local_70.ptr.isSet = false;
  capnproto_test::capnp::test::TestExtends::Client::graultRequest
            (&pipelineRequest2,(Client *)&response,&local_70);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&response.super_Reader.reader);
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  ::send((Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
          *)&pipelinePromise2,(int)&pipelineRequest2,__buf_01,(size_t)value_00,iVar3);
  response.super_Reader.schema.super_Schema.raw = (Schema)(RawBrandedSchema *)0x0;
  response.super_Reader.reader.segment = (SegmentReader *)0x0;
  response.super_Reader.reader.capTable = (CapTableReader *)(NULL_STRUCT_SCHEMA + 0x48);
  response.super_Reader.reader.data = (void *)0x0;
  response.super_Reader.reader.pointers = (WirePointer *)0x0;
  response.super_Reader.reader.dataSize = 0;
  response.super_Reader.reader.pointerCount = 0;
  response.super_Reader.reader._38_2_ = 0;
  response.super_Reader.reader.nestingLimit = 0;
  response.super_Reader.reader._44_4_ = 0;
  response.hook.disposer = (Disposer *)0x0;
  RemotePromise<capnp::DynamicStruct>::operator=
            (&promise,(RemotePromise<capnp::DynamicStruct> *)&response);
  RemotePromise<capnp::DynamicStruct>::~RemotePromise
            ((RemotePromise<capnp::DynamicStruct> *)&response);
  if (callCount != 0 && kj::_::Debug::minSeverity < 3) {
    response.super_Reader.schema.super_Schema.raw =
         (Schema)((ulong)response.super_Reader.schema.super_Schema.raw & 0xffffffff00000000);
    kj::_::Debug::log<char_const(&)[36],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x148,ERROR,"\"failed: expected \" \"(0) == (callCount)\", 0, callCount",
               (char (*) [36])"failed: expected (0) == (callCount)",(int *)&response,&callCount);
  }
  if ((chainedCallCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    response.super_Reader.schema.super_Schema.raw =
         (Schema)((ulong)response.super_Reader.schema.super_Schema.raw & 0xffffffff00000000);
    kj::_::Debug::log<char_const(&)[43],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x149,ERROR,
               "\"failed: expected \" \"(0) == (chainedCallCount)\", 0, chainedCallCount",
               (char (*) [43])"failed: expected (0) == (chainedCallCount)",(int *)&response,
               &chainedCallCount);
  }
  kj::Promise<capnp::Response<capnp::DynamicStruct>_>::wait
            ((Promise<capnp::Response<capnp::DynamicStruct>_> *)&response,&pipelinePromise);
  name_01.content.size_ = 2;
  name_01.content.ptr = "x";
  DynamicStruct::Reader::get((Reader *)&response2,&response.super_Reader,name_01);
  local_2b8 = (ArrayPtr<const_char>)
              DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply((Reader *)&response2)
  ;
  bVar2 = kj::operator==("bar",(StringPtr *)&local_2b8);
  DynamicValue::Reader::~Reader((Reader *)&response2);
  if (!bVar2 && kj::_::Debug::minSeverity < 3) {
    name_02.content.size_ = 2;
    name_02.content.ptr = "x";
    DynamicStruct::Reader::get((Reader *)&response2,&response.super_Reader,name_02);
    local_2b8 = (ArrayPtr<const_char>)
                DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
                          ((Reader *)&response2);
    kj::_::Debug::log<char_const(&)[59],char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x14c,ERROR,
               "\"failed: expected \" \"(\\\"bar\\\") == (response.get(\\\"x\\\").as<Text>())\", \"bar\", response.get(\"x\").as<Text>()"
               ,(char (*) [59])"failed: expected (\"bar\") == (response.get(\"x\").as<Text>())",
               (char (*) [4])0x501447,(Reader *)&local_2b8);
    DynamicValue::Reader::~Reader((Reader *)&response2);
  }
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestAllTypes>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestAllTypes>_> *)&response2,
             &pipelinePromise2);
  reader._reader.capTable = response2.super_Reader._reader.capTable;
  reader._reader.segment = response2.super_Reader._reader.segment;
  reader._reader.data = response2.super_Reader._reader.data;
  reader._reader.pointers = response2.super_Reader._reader.pointers;
  reader._reader.dataSize = response2.super_Reader._reader.dataSize;
  reader._reader.pointerCount = response2.super_Reader._reader.pointerCount;
  reader._reader._38_2_ = response2.super_Reader._reader._38_2_;
  reader._reader.nestingLimit = response2.super_Reader._reader.nestingLimit;
  reader._reader._44_4_ = response2.super_Reader._reader._44_4_;
  checkTestMessage(reader);
  if (callCount != 3 && kj::_::Debug::minSeverity < 3) {
    local_2b8.ptr._0_4_ = 3;
    kj::_::Debug::log<char_const(&)[36],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x151,ERROR,"\"failed: expected \" \"(3) == (callCount)\", 3, callCount",
               (char (*) [36])"failed: expected (3) == (callCount)",(int *)&local_2b8,&callCount);
  }
  if ((chainedCallCount != 1) && (kj::_::Debug::minSeverity < 3)) {
    local_2b8.ptr._0_4_ = 1;
    kj::_::Debug::log<char_const(&)[43],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x152,ERROR,
               "\"failed: expected \" \"(1) == (chainedCallCount)\", 1, chainedCallCount",
               (char (*) [43])"failed: expected (1) == (chainedCallCount)",(int *)&local_2b8,
               &chainedCallCount);
  }
  kj::Own<capnp::ResponseHook>::dispose(&response2.hook);
  kj::Own<capnp::ResponseHook>::dispose(&response.hook);
  RemotePromise<capnproto_test::capnp::test::TestAllTypes>::~RemotePromise(&pipelinePromise2);
  kj::Own<capnp::RequestHook>::dispose(&pipelineRequest2.hook);
  RemotePromise<capnp::DynamicStruct>::~RemotePromise(&pipelinePromise);
  kj::Own<capnp::RequestHook>::dispose(&pipelineRequest.hook);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&outCap);
  RemotePromise<capnp::DynamicStruct>::~RemotePromise(&promise);
  kj::Own<capnp::RequestHook>::dispose(&request.hook);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&local_218);
  kj::WaitScope::~WaitScope(&waitScope);
  kj::EventLoop::~EventLoop(&loop);
  return;
}

Assistant:

TEST(Capability, DynamicClientPipelining) {
  kj::EventLoop loop;
  kj::WaitScope waitScope(loop);

  int callCount = 0;
  int chainedCallCount = 0;
  DynamicCapability::Client client =
      test::TestPipeline::Client(kj::heap<TestPipelineImpl>(callCount));

  auto request = client.newRequest("getCap");
  request.set("n", 234);
  request.set("inCap", test::TestInterface::Client(kj::heap<TestInterfaceImpl>(chainedCallCount)));

  auto promise = request.send();

  auto outCap = promise.get("outBox").releaseAs<DynamicStruct>()
                       .get("cap").releaseAs<DynamicCapability>();
  auto pipelineRequest = outCap.newRequest("foo");
  pipelineRequest.set("i", 321);
  auto pipelinePromise = pipelineRequest.send();

  auto pipelineRequest2 = outCap.castAs<test::TestExtends>().graultRequest();
  auto pipelinePromise2 = pipelineRequest2.send();

  promise = nullptr;  // Just to be annoying, drop the original promise.

  EXPECT_EQ(0, callCount);
  EXPECT_EQ(0, chainedCallCount);

  auto response = pipelinePromise.wait(waitScope);
  EXPECT_EQ("bar", response.get("x").as<Text>());

  auto response2 = pipelinePromise2.wait(waitScope);
  checkTestMessage(response2);

  EXPECT_EQ(3, callCount);
  EXPECT_EQ(1, chainedCallCount);
}